

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_mmap(ly_ctx *ctx,int fd,size_t addsize,size_t *length,void **addr)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  int *piVar4;
  char *pcVar5;
  char *format;
  undefined1 local_c8 [8];
  stat sb;
  
  if (fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x102,"int lyp_mmap(struct ly_ctx *, int, size_t, size_t *, void **)");
  }
  iVar1 = fstat(fd,(stat *)local_c8);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    format = "Failed to stat the file descriptor (%s) for the mmap().";
  }
  else {
    if (((uint)sb.st_nlink & 0xf000) != 0x8000) {
      ly_log(ctx,LY_LLERR,LY_EINVAL,"File to mmap() is not a regular file.");
      return 1;
    }
    if (sb.st_rdev == 0) {
      *addr = (void *)0x0;
      return 0;
    }
    sb.__glibc_reserved[2] = (__syscall_slong_t)ctx;
    lVar2 = sysconf(0x1e);
    if ((ulong)(lVar2 - (long)sb.st_rdev % lVar2) < addsize + 1 || (long)sb.st_rdev % lVar2 == 0) {
      *length = lVar2 + sb.st_rdev;
      pvVar3 = mmap((void *)0x0,lVar2 + sb.st_rdev,3,0x22,-1,0);
      *addr = pvVar3;
      iVar1 = 0x12;
    }
    else {
      sb.st_rdev = sb.st_rdev + addsize + 1;
      *length = sb.st_rdev;
      pvVar3 = (void *)0x0;
      iVar1 = 2;
    }
    pvVar3 = mmap(pvVar3,sb.st_rdev,3,iVar1,fd,0);
    ctx = (ly_ctx *)sb.__glibc_reserved[2];
    *addr = pvVar3;
    if (pvVar3 != (void *)0xffffffffffffffff) {
      return 0;
    }
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    format = "mmap() failed (%s).";
  }
  ly_log(ctx,LY_LLERR,LY_ESYS,format,pcVar5);
  return 1;
}

Assistant:

int
lyp_mmap(struct ly_ctx *ctx, int fd, size_t addsize, size_t *length, void **addr)
{
    struct stat sb;
    long pagesize;
    size_t m;

    assert(fd >= 0);
    if (fstat(fd, &sb) == -1) {
        LOGERR(ctx, LY_ESYS, "Failed to stat the file descriptor (%s) for the mmap().", strerror(errno));
        return 1;
    }
    if (!S_ISREG(sb.st_mode)) {
        LOGERR(ctx, LY_EINVAL, "File to mmap() is not a regular file.");
        return 1;
    }
    if (!sb.st_size) {
        *addr = NULL;
        return 0;
    }
    pagesize = sysconf(_SC_PAGESIZE);
    ++addsize;                       /* at least one additional byte for terminating NULL byte */

    m = sb.st_size % pagesize;
    if (m && pagesize - m >= addsize) {
        /* there will be enough space after the file content mapping to provide zeroed additional bytes */
        *length = sb.st_size + addsize;
        *addr = mmap(NULL, *length, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, 0);
    } else {
        /* there will not be enough bytes after the file content mapping for the additional bytes and some of them
         * would overflow into another page that would not be zeroed and any access into it would generate SIGBUS.
         * Therefore we have to do the following hack with double mapping. First, the required number of bytes
         * (including the additional bytes) is required as anonymous and thus they will be really provided (actually more
         * because of using whole pages) and also initialized by zeros. Then, the file is mapped to the same address
         * where the anonymous mapping starts. */
        *length = sb.st_size + pagesize;
        *addr = mmap(NULL, *length, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
        *addr = mmap(*addr, sb.st_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_FIXED, fd, 0);
    }
    if (*addr == MAP_FAILED) {
        LOGERR(ctx, LY_ESYS, "mmap() failed (%s).", strerror(errno));
        return 1;
    }

    return 0;
}